

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O1

void __thiscall ECDSAAdaptor_Adapt_Test::TestBody(ECDSAAdaptor_Adapt_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteData sig;
  ByteData raw_sig;
  SigHashType sig_hash;
  string local_98;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string local_68;
  ByteData local_48;
  ByteData local_30;
  SigHashType local_14;
  
  cfd::core::SigHashType::SigHashType(&local_14);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_30,&sig_der,&local_14);
  cfd::core::AdaptorUtil::Adapt(&local_48,&adaptor_sig2,&secret);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_98,&local_30);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,&local_48);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_78,"raw_sig.GetHex()","sig.GetHex()",&local_98,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_98._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
      local_98._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ECDSAAdaptor, Adapt) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);
  auto sig = AdaptorUtil::Adapt(adaptor_sig2, secret);

  EXPECT_EQ(raw_sig.GetHex(), sig.GetHex());
}